

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::format
          (RuleBasedNumberFormat *this,DecimalQuantity *number,UnicodeString *appendTo,
          FieldPosition *pos,UErrorCode *status)

{
  bool bVar1;
  int64_t iVar2;
  NumberFormat *pNVar3;
  DecimalQuantity *this_00;
  size_t size;
  Formattable f;
  DecimalQuantity copy;
  Formattable local_f0;
  DecimalQuantity local_80;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    icu_63::number::impl::DecimalQuantity::DecimalQuantity(&local_80,number);
    bVar1 = icu_63::number::impl::DecimalQuantity::fitsInLong(&local_80,false);
    if (bVar1) {
      iVar2 = icu_63::number::impl::DecimalQuantity::toLong(number,false);
      (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0xf])
                (this,iVar2,appendTo,pos,status);
    }
    else {
      icu_63::number::impl::DecimalQuantity::roundToMagnitude
                (&local_80,0,UNUM_FOUND_HALFEVEN,status);
      bVar1 = icu_63::number::impl::DecimalQuantity::fitsInLong(&local_80,false);
      if (bVar1) {
        icu_63::number::impl::DecimalQuantity::toDouble(number);
        (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[9])
                  (this,appendTo,pos,status);
      }
      else {
        size = 1;
        pNVar3 = NumberFormat::createInstance(&this->locale,UNUM_DECIMAL,status);
        if ((pNVar3 == (NumberFormat *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
          *status = U_MEMORY_ALLOCATION_ERROR;
        }
        else if (pNVar3 != (NumberFormat *)0x0) {
          Formattable::Formattable(&local_f0);
          this_00 = (DecimalQuantity *)UMemory::operator_new((UMemory *)0x50,size);
          if (this_00 == (DecimalQuantity *)0x0) {
            if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
              *status = U_MEMORY_ALLOCATION_ERROR;
            }
          }
          else {
            icu_63::number::impl::DecimalQuantity::DecimalQuantity(this_00,number);
            Formattable::adoptDecimalQuantity(&local_f0,this_00);
            (*(pNVar3->super_Format).super_UObject._vptr_UObject[5])
                      (pNVar3,&local_f0,appendTo,pos,status);
          }
          Formattable::~Formattable(&local_f0);
          (*(pNVar3->super_Format).super_UObject._vptr_UObject[1])(pNVar3);
        }
      }
    }
    icu_63::number::impl::DecimalQuantity::~DecimalQuantity(&local_80);
  }
  return appendTo;
}

Assistant:

UnicodeString&
RuleBasedNumberFormat::format(const DecimalQuantity &number,
                     UnicodeString& appendTo,
                     FieldPosition& pos,
                     UErrorCode &status) const {
    if (U_FAILURE(status)) {
        return appendTo;
    }
    DecimalQuantity copy(number);
    if (copy.fitsInLong()) {
        format(number.toLong(), appendTo, pos, status);
    }
    else {
        copy.roundToMagnitude(0, number::impl::RoundingMode::UNUM_ROUND_HALFEVEN, status);
        if (copy.fitsInLong()) {
            format(number.toDouble(), appendTo, pos, status);
        }
        else {
            // We're outside of our normal range that this framework can handle.
            // The DecimalFormat will provide more accurate results.

            // TODO this section should probably be optimized. The DecimalFormat is shared in ICU4J.
            LocalPointer<NumberFormat> decimalFormat(NumberFormat::createInstance(locale, UNUM_DECIMAL, status), status);
            if (decimalFormat.isNull()) {
                return appendTo;
            }
            Formattable f;
            LocalPointer<DecimalQuantity> decimalQuantity(new DecimalQuantity(number), status);
            if (decimalQuantity.isNull()) {
                return appendTo;
            }
            f.adoptDecimalQuantity(decimalQuantity.orphan()); // f now owns decimalQuantity.
            decimalFormat->format(f, appendTo, pos, status);
        }
    }
    return appendTo;
}